

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int refineBySim2_init(saucy *s,coloring *c)

{
  int iVar1;
  Vec_Int_t *randVec_00;
  saucy_graph *__ptr;
  int local_30;
  int nsplits;
  int j;
  int i;
  Vec_Int_t *randVec;
  saucy_graph *g;
  coloring *c_local;
  saucy *s_local;
  
  nsplits = 0;
  while( true ) {
    if (NUM_SIM2_ITERATION <= nsplits) {
      return 1;
    }
    randVec_00 = assignRandomBitsToCells(s->pNtk,c);
    __ptr = buildSim2Graph(s->pNtk,c,randVec_00,s->iDep,s->oDep,s->topOrder,s->obs,s->ctrl);
    if (__ptr == (saucy_graph *)0x0) break;
    s->adj = __ptr->adj;
    s->edg = __ptr->edg;
    iVar1 = s->nsplits;
    for (local_30 = 0; local_30 < s->n; local_30 = c->clen[local_30] + 1 + local_30) {
      add_induce(s,c,local_30);
    }
    refine(s,c);
    if (iVar1 < s->nsplits) {
      nsplits = 0;
      for (local_30 = 0; local_30 < s->n; local_30 = c->clen[local_30] + 1 + local_30) {
        add_induce(s,c,local_30);
      }
      refineByDepGraph(s,c);
    }
    Vec_IntFree(randVec_00);
    if (__ptr->adj != (int *)0x0) {
      free(__ptr->adj);
      __ptr->adj = (int *)0x0;
    }
    if (__ptr->edg != (int *)0x0) {
      free(__ptr->edg);
      __ptr->edg = (int *)0x0;
    }
    if (__ptr != (saucy_graph *)0x0) {
      free(__ptr);
    }
    nsplits = nsplits + 1;
  }
  __assert_fail("g != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSaucy.c"
                ,0x562,"int refineBySim2_init(struct saucy *, struct coloring *)");
}

Assistant:

static int
refineBySim2_init(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;    
    int i, j;
    int nsplits;    
    
    for (i = 0; i < NUM_SIM2_ITERATION; i++) {
        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim2Graph(s->pNtk, c, randVec, s->iDep, s->oDep, s->topOrder, s->obs,  s->ctrl);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;
        
        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {                     
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        
        Vec_IntFree(randVec);
        
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    return 1;
}